

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O0

Vec_Int_t * Llb_Nonlin4CreateOrderSimple(Aig_Man_t *pAig)

{
  Vec_Ptr_t *p;
  int iVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pAVar2;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vOrder;
  Aig_Man_t *pAig_local;
  
  local_28 = 0;
  iVar1 = Aig_ManObjNumMax(pAig);
  p_00 = Vec_IntStartFull(iVar1);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pAig->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_24);
    iVar1 = Aig_ObjId(pAVar2);
    Vec_IntWriteEntry(p_00,iVar1,local_28);
    local_28 = local_28 + 1;
  }
  for (local_24 = 0; iVar1 = Saig_ManRegNum(pAig), local_24 < iVar1; local_24 = local_24 + 1) {
    p = pAig->vCos;
    iVar1 = Saig_ManPoNum(pAig);
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p,local_24 + iVar1);
    iVar1 = Aig_ObjId(pAVar2);
    Vec_IntWriteEntry(p_00,iVar1,local_28);
    local_28 = local_28 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CreateOrderSimple( Aig_Man_t * pAig )
{
    Vec_Int_t * vOrder;
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    vOrder = Vec_IntStartFull( Aig_ManObjNumMax(pAig) );
    Aig_ManForEachCi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vOrder, Aig_ObjId(pObj), Counter++ );
    return vOrder;
}